

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyHashDeleteEntry(SyHash *pHash,void *pKey,sxu32 nKeyLen,void **ppUserData)

{
  SyHashEntry_Pr *pSVar1;
  sxi32 sVar2;
  SyHashEntry_Pr *pChunk;
  SyHashEntry_Pr **ppSVar3;
  
  pChunk = HashGetEntry(pHash,pKey,nKeyLen);
  if (pChunk != (SyHashEntry_Pr *)0x0) {
    if (pChunk->pPrevCollide == (SyHashEntry_Pr *)0x0) {
      ppSVar3 = pHash->apBucket + (pHash->nBucketSize - 1 & pChunk->nHash);
    }
    else {
      ppSVar3 = &pChunk->pPrevCollide->pNextCollide;
    }
    *ppSVar3 = pChunk->pNextCollide;
    if (pChunk->pNextCollide != (SyHashEntry_Pr *)0x0) {
      pChunk->pNextCollide->pPrevCollide = pChunk->pPrevCollide;
    }
    if (pHash->pList == pChunk) {
      pHash->pList = pHash->pList->pNext;
    }
    pSVar1 = pChunk->pPrev;
    if (pSVar1 != (SyHashEntry_Pr *)0x0) {
      pSVar1->pNext = pChunk->pNext;
    }
    if (pChunk->pNext != (SyHashEntry_Pr *)0x0) {
      pChunk->pNext->pPrev = pSVar1;
    }
    pHash->nEntry = pHash->nEntry - 1;
    if (ppUserData != (void **)0x0) {
      *ppUserData = pChunk->pUserData;
    }
    sVar2 = SyMemBackendPoolFree(pHash->pAllocator,pChunk);
    return sVar2;
  }
  return -6;
}

Assistant:

JX9_PRIVATE sxi32 SyHashDeleteEntry(SyHash *pHash, const void *pKey, sxu32 nKeyLen, void **ppUserData)
{
	SyHashEntry_Pr *pEntry;
	sxi32 rc;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) ){
		return SXERR_CORRUPT;
	}
#endif
	pEntry = HashGetEntry(&(*pHash), pKey, nKeyLen);
	if( pEntry == 0 ){
		return SXERR_NOTFOUND;
	}
	rc = HashDeleteEntry(&(*pHash), pEntry, ppUserData);
	return rc;
}